

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O0

void __thiscall re2::PrefilterTree::~PrefilterTree(PrefilterTree *this)

{
  Prefilter *this_00;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this_01;
  size_type sVar1;
  reference ppPVar2;
  reference pvVar3;
  ulong local_20;
  size_t i_1;
  size_t i;
  PrefilterTree *this_local;
  
  i_1 = 0;
  while( true ) {
    sVar1 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size
                      (&this->prefilter_vec_);
    if (sVar1 <= i_1) break;
    ppPVar2 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                        (&this->prefilter_vec_,i_1);
    this_00 = *ppPVar2;
    if (this_00 != (Prefilter *)0x0) {
      Prefilter::~Prefilter(this_00);
      operator_delete(this_00);
    }
    i_1 = i_1 + 1;
  }
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::size
                      (&this->entries_);
    if (sVar1 <= local_20) break;
    pvVar3 = std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::
             operator[](&this->entries_,local_20);
    this_01 = pvVar3->parents;
    if (this_01 != (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x0
       ) {
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map(this_01)
      ;
      operator_delete(this_01);
    }
    local_20 = local_20 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector(&this->atom_index_to_id_);
  std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::~vector(&this->prefilter_vec_);
  std::vector<int,_std::allocator<int>_>::~vector(&this->unfiltered_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>_>
  ::~map(&this->node_map_);
  std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::~vector
            (&this->entries_);
  return;
}

Assistant:

PrefilterTree::~PrefilterTree() {
  for (size_t i = 0; i < prefilter_vec_.size(); i++)
    delete prefilter_vec_[i];

  for (size_t i = 0; i < entries_.size(); i++)
    delete entries_[i].parents;
}